

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlBalance(NodeAVL *nd)

{
  int iVar1;
  NodeAVL *pNVar2;
  NodeAVL *in_RDI;
  NodeAVL *local_8;
  
  avlFixHeight(in_RDI);
  iVar1 = avlBfactor(in_RDI);
  if (iVar1 == 2) {
    iVar1 = avlBfactor(in_RDI);
    if (iVar1 < 0) {
      pNVar2 = avlRotateRight(in_RDI);
      in_RDI->right = pNVar2;
    }
    local_8 = avlRotateLeft(in_RDI);
  }
  else {
    iVar1 = avlBfactor(in_RDI);
    local_8 = in_RDI;
    if (iVar1 == -2) {
      iVar1 = avlBfactor(in_RDI);
      if (0 < iVar1) {
        pNVar2 = avlRotateLeft(in_RDI);
        in_RDI->left = pNVar2;
      }
      local_8 = avlRotateRight(in_RDI);
    }
  }
  return local_8;
}

Assistant:

static
NodeAVL* avlBalance( NodeAVL* nd ){
    #ifdef DEBUG_AVL
      printf( "avlBalance id=%d\n", nd->id );
    #endif
    avlFixHeight(nd);
    if( avlBfactor(nd)==2 ){
        if( avlBfactor(nd->right) < 0 ) nd->right = avlRotateRight(nd->right);
        return avlRotateLeft(nd);
    }
    if( avlBfactor(nd)==-2 ){
        if( avlBfactor(nd->left) > 0  ) nd->left = avlRotateLeft(nd->left);
        return avlRotateRight(nd);
    }
    return nd;
}